

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O0

void __thiscall
flatbuffers::ToStringVisitor::ToStringVisitor
          (ToStringVisitor *this,string *delimiter,bool quotes,string *indent,bool vdelimited)

{
  bool vdelimited_local;
  string *indent_local;
  bool quotes_local;
  string *delimiter_local;
  ToStringVisitor *this_local;
  
  IterationVisitor::IterationVisitor(&this->super_IterationVisitor);
  (this->super_IterationVisitor)._vptr_IterationVisitor = (_func_int **)&PTR_StartSequence_0032bec8;
  std::__cxx11::string::string((string *)&this->s);
  std::__cxx11::string::string((string *)&this->d,(string *)delimiter);
  this->q = quotes;
  std::__cxx11::string::string((string *)&this->in,(string *)indent);
  this->indent_level = 0;
  this->vector_delimited = vdelimited;
  return;
}

Assistant:

ToStringVisitor(std::string delimiter, bool quotes, std::string indent,
                  bool vdelimited = true)
      : d(delimiter),
        q(quotes),
        in(indent),
        indent_level(0),
        vector_delimited(vdelimited) {}